

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::processArgs(Echo *this)

{
  helicsCLI11App *this_00;
  long in_RDI;
  helicsCLI11App app;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  allocator<char> *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  string local_478 [39];
  allocator<char> local_451 [40];
  allocator<char> local_429 [21];
  AppFormatMode in_stack_fffffffffffffbec;
  string *in_stack_fffffffffffffbf0;
  App *in_stack_fffffffffffffbf8;
  allocator<char> local_3c9;
  string *in_stack_fffffffffffffc38;
  TimeRepresentation<count_time<9,_long>_> *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  App *in_stack_fffffffffffffc50;
  helicsCLI11App *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  helicsCLI11App *in_stack_fffffffffffffdf0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  helicsCLI11App::helicsCLI11App
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbff);
  std::__cxx11::string::~string(in_stack_fffffffffffffb30);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  this_00 = (helicsCLI11App *)(in_RDI + 0xf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_451);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_429);
  if ((*(byte *)(in_RDI + 0x82) & 1) == 0) {
    CLI::App::parse(&this_00->super_App,in_stack_fffffffffffffb28);
  }
  else if ((*(byte *)(in_RDI + 0x84) & 1) != 0) {
    helicsCLI11App::remove_helics_specifics(in_stack_fffffffffffffca0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    CLI::App::help(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
    std::operator<<((ostream *)&std::cout,local_478);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb67);
  }
  helicsCLI11App::~helicsCLI11App(this_00);
  return;
}

Assistant:

void Echo::processArgs()
    {
        helicsCLI11App app("Options specific to the Echo App");
        app.add_option("--delay", delayTime, "the delay with which the echo app will echo message");
        if (!deactivated) {
            app.parse(remArgs);
        } else if (helpMode) {
            app.remove_helics_specifics();
            std::cout << app.help();
        }
    }